

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsTheOneSpecifiedInConstructor_Test::testBody
          (TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsTheOneSpecifiedInConstructor_Test
           *this)

{
  UtestShell *pUVar1;
  MemoryLeakDetector *pMVar2;
  TestTerminator *pTVar3;
  SimpleString local_1300;
  MemoryLeakWarningPlugin memoryLeakWarningPlugin;
  MemoryLeakDetector localDetector;
  
  MemoryLeakDetector::MemoryLeakDetector
            (&localDetector,
             &(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningLocalDetectorTest).dummy.
              super_MemoryLeakFailure);
  SimpleString::SimpleString(&local_1300,"TestMemoryLeakWarningPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
            (&memoryLeakWarningPlugin,&local_1300,&localDetector);
  SimpleString::~SimpleString(&local_1300);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakWarningPlugin::getMemoryLeakDetector(&memoryLeakWarningPlugin);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&localDetector,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x36,pTVar3);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(&memoryLeakWarningPlugin);
  MemoryLeakDetector::~MemoryLeakDetector(&localDetector);
  return;
}

Assistant:

TEST(MemoryLeakWarningLocalDetectorTest, localDetectorIsTheOneSpecifiedInConstructor)
{
    MemoryLeakDetector localDetector(&dummy);
    MemoryLeakWarningPlugin memoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", &localDetector);
    POINTERS_EQUAL(&localDetector, memoryLeakWarningPlugin.getMemoryLeakDetector());
}